

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.h
# Opt level: O2

void __thiscall
sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_>::onMessage
          (LengthHeaderCodec<std::shared_ptr<sznet::net::KcpConnection>_> *this,
          shared_ptr<sznet::net::KcpConnection> *conn,Buffer *buf,Timestamp receiveTime)

{
  int v;
  ulong uVar1;
  self *this_00;
  pointer pcVar2;
  size_t len;
  SourceFile file;
  undefined1 local_1018 [8];
  string message;
  undefined1 local_48 [12];
  shared_ptr<sznet::net::KcpConnection> *local_38;
  
  local_38 = conn;
  while( true ) {
    uVar1 = buf->m_writerIndex - buf->m_readerIndex;
    if (uVar1 < 4) {
      return;
    }
    v = *(int *)((buf->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start + buf->m_readerIndex);
    len = (size_t)v;
    if ((long)len < 0) break;
    if (uVar1 < len + 4) {
      return;
    }
    Buffer::retrieve(buf,4);
    local_1018 = (undefined1  [8])&message._M_string_length;
    pcVar2 = (buf->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + buf->m_readerIndex;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1018,pcVar2,pcVar2 + len);
    std::
    function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
    ::operator()(&this->m_messageCallback,local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1018,
                 receiveTime);
    Buffer::retrieve(buf,len);
    std::__cxx11::string::~string((string *)local_1018);
  }
  Logger::SourceFile::SourceFile<94>
            ((SourceFile *)local_48,
             (char (*) [94])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Codec.h"
            );
  file._12_4_ = 0;
  file.m_data = (char *)local_48._0_8_;
  file.m_size = local_48._8_4_;
  Logger::Logger((Logger *)local_1018,file,0x2b,ERROR);
  this_00 = LogStream::operator<<((LogStream *)&message,"Invalid length ");
  LogStream::operator<<(this_00,v);
  Logger::~Logger((Logger *)local_1018);
  KcpConnection::forceClose
            ((local_38->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  return;
}

Assistant:

void onMessage(const TSPTR& conn, Buffer* buf, Timestamp receiveTime)
	{
		// kHeaderLen == 4
		while (buf->readableBytes() >= kHeaderLen)
		{
			// FIXME: use Buffer::peekInt32()
			const void* data = buf->peek();
			// SIGBUS
			const int32_t len = *static_cast<const int32_t*>(data);
			if (len < 0)
			{
				LOG_ERROR << "Invalid length " << len;
				conn->forceClose();
				break;
			}
			else if (buf->readableBytes() >= len + kHeaderLen)
			{
				buf->retrieve(kHeaderLen);
				string message(buf->peek(), len);
				m_messageCallback(conn, message, receiveTime);
				buf->retrieve(len);
			}
			else
			{
				break;
			}
		}
	}